

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_render_conic(PWorker worker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long local_268;
  long local_260;
  uint local_258;
  uint local_254;
  int split;
  int draw;
  TPos dy;
  TPos dx;
  PVG_FT_Vector *arc;
  PVG_FT_Vector bez_stack [33];
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control_local;
  PWorker worker_local;
  
  dx = (TPos)&arc;
  arc = (PVG_FT_Vector *)(to->x * 4);
  bez_stack[0].x = to->y * 4;
  lVar1 = control->x;
  bez_stack[0].y = lVar1 * 4;
  lVar2 = control->y;
  bez_stack[1].x = lVar2 * 4;
  bez_stack[1].y = worker->x;
  bez_stack[2].x = worker->y;
  lVar3 = lVar2 * 4 >> 8;
  if ((((bez_stack[0].x >> 8 < worker->max_ey) || (lVar3 < worker->max_ey)) ||
      (bez_stack[2].x >> 8 < worker->max_ey)) &&
     (((worker->min_ey <= bez_stack[0].x >> 8 || (worker->min_ey <= lVar3)) ||
      (worker->min_ey <= bez_stack[2].x >> 8)))) {
    if ((long)arc + lVar1 * -8 + bez_stack[1].y < 0) {
      local_260 = -((long)arc + lVar1 * -8 + bez_stack[1].y);
    }
    else {
      local_260 = (long)arc + lVar1 * -8 + bez_stack[1].y;
    }
    dy = local_260;
    if (bez_stack[2].x + bez_stack[0].x + lVar2 * -8 < 0) {
      local_268 = -(bez_stack[2].x + bez_stack[0].x + lVar2 * -8);
    }
    else {
      local_268 = bez_stack[2].x + bez_stack[0].x + lVar2 * -8;
    }
    if (local_260 < local_268) {
      dy = local_268;
    }
    local_254 = 1;
    for (; 0x40 < dy; dy = dy >> 2) {
      local_254 = local_254 << 1;
    }
    do {
      for (local_258 = 1; (local_254 & local_258) == 0; local_258 = local_258 << 1) {
        gray_split_conic((PVG_FT_Vector *)dx);
        dx = dx + 0x20;
      }
      gray_render_line(worker,*(TPos *)dx,*(TPos *)(dx + 8));
      dx = dx + -0x20;
      local_254 = local_254 - 1;
    } while (local_254 != 0);
  }
  else {
    worker->x = (TPos)arc;
    worker->y = bez_stack[0].x;
  }
  return;
}

Assistant:

static void
  gray_render_conic( RAS_ARG_ const PVG_FT_Vector*  control,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 2 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    TPos        dx, dy;
    int         draw, split;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control->x );
    arc[1].y = UPSCALE( control->y );
    arc[2].x = ras.x;
    arc[2].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    dx = PVG_FT_ABS( arc[2].x + arc[0].x - 2 * arc[1].x );
    dy = PVG_FT_ABS( arc[2].y + arc[0].y - 2 * arc[1].y );
    if ( dx < dy )
      dx = dy;

    /* We can calculate the number of necessary bisections because  */
    /* each bisection predictably reduces deviation exactly 4-fold. */
    /* Even 32-bit deviation would vanish after 16 bisections.      */
    draw = 1;
    while ( dx > ONE_PIXEL / 4 )
    {
      dx >>= 2;
      draw <<= 1;
    }

    /* We use decrement counter to count the total number of segments */
    /* to draw starting from 2^level. Before each draw we split as    */
    /* many times as there are trailing zeros in the counter.         */
    do
    {
      split = 1;
      while ( ( draw & split ) == 0 )
      {
        gray_split_conic( arc );
        arc += 2;
        split <<= 1;
      }

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );
      arc -= 2;

    } while ( --draw );
  }